

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  MathService *this;
  element_type *peVar2;
  element_type *peVar3;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  undefined1 local_168 [32];
  shared_ptr<IMathService> local_148;
  undefined1 local_138 [24];
  function<std::shared_ptr<IMathService>_()> local_120;
  undefined1 local_100 [16];
  undefined1 local_f0 [32];
  undefined1 local_d0 [8];
  shared_ptr<MathService> test;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  float local_a8 [2];
  undefined1 local_a0 [8];
  shared_ptr<IMathService> mathService;
  undefined1 local_80 [8];
  ServiceLocator locator;
  
  locator.creators._M_h._M_single_bucket._4_4_ = 0;
  ServiceLocator::ServiceLocator((ServiceLocator *)local_80);
  this = (MathService *)operator_new(0x10);
  (this->super_IMathService)._vptr_IMathService = (_func_int **)0x0;
  *(undefined8 *)&this->state = 0;
  MathService::MathService(this);
  ServiceLocator::registerInstance<IMathService>((ServiceLocator *)local_80,(IMathService *)this);
  ServiceLocator::resolve<IMathService>((ServiceLocator *)local_a0);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_a0);
  if (!bVar1) {
    __assert_fail("mathService",
                  "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                  ,0x24,"int main()");
  }
  peVar2 = std::__shared_ptr_access<IMathService,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<IMathService,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_a0);
  local_a8[1] = 10.0;
  local_a8[0] = 20.0;
  (*peVar2->_vptr_IMathService[2])(peVar2,local_a8 + 1,local_a8);
  if ((extraout_XMM0_Da != 30.0) || (NAN(extraout_XMM0_Da))) {
    __assert_fail("mathService->add(10, 20) == 30",
                  "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                  ,0x25,"int main()");
  }
  peVar2 = std::__shared_ptr_access<IMathService,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<IMathService,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_a0);
  local_ac = 0x41f00000;
  local_b0 = 0x41200000;
  (*peVar2->_vptr_IMathService[3])(peVar2,&local_ac,&local_b0);
  if ((extraout_XMM0_Da_00 != 20.0) || (NAN(extraout_XMM0_Da_00))) {
    __assert_fail("mathService->subtract(30, 10) == 20",
                  "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                  ,0x26,"int main()");
  }
  peVar2 = std::__shared_ptr_access<IMathService,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<IMathService,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_a0);
  local_b4 = 0x40000000;
  local_b8 = 0x40200000;
  (*peVar2->_vptr_IMathService[4])(peVar2,&local_b4,&local_b8);
  if ((extraout_XMM0_Da_01 != 5.0) || (NAN(extraout_XMM0_Da_01))) {
    __assert_fail("mathService->multiply(2, 2.5) == 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                  ,0x27,"int main()");
  }
  peVar2 = std::__shared_ptr_access<IMathService,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<IMathService,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_a0);
  test.super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       0x41f00000;
  test.super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       0x41200000;
  (*peVar2->_vptr_IMathService[5])
            (peVar2,(undefined1 *)
                    ((long)&test.super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4),
             &test.super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((extraout_XMM0_Da_02 != 3.0) || (NAN(extraout_XMM0_Da_02))) {
    __assert_fail("mathService->divide(30, 10) == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                  ,0x28,"int main()");
  }
  std::static_pointer_cast<MathService,IMathService>((shared_ptr<IMathService> *)local_d0);
  peVar3 = std::__shared_ptr_access<MathService,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MathService,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_d0);
  if (peVar3->state != 0) {
    __assert_fail("test->state == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                  ,0x2c,"int main()");
  }
  peVar3 = std::__shared_ptr_access<MathService,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MathService,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_d0);
  peVar3->state = 1;
  ServiceLocator::resolve<IMathService>((ServiceLocator *)local_f0);
  std::static_pointer_cast<MathService,IMathService>((shared_ptr<IMathService> *)(local_f0 + 0x10));
  std::shared_ptr<MathService>::operator=
            ((shared_ptr<MathService> *)local_d0,(shared_ptr<MathService> *)(local_f0 + 0x10));
  std::shared_ptr<MathService>::~shared_ptr((shared_ptr<MathService> *)(local_f0 + 0x10));
  std::shared_ptr<IMathService>::~shared_ptr((shared_ptr<IMathService> *)local_f0);
  peVar3 = std::__shared_ptr_access<MathService,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MathService,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_d0);
  if (peVar3->state != 1) {
    __assert_fail("test->state == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                  ,0x2f,"int main()");
  }
  ServiceLocator::clear((ServiceLocator *)local_80);
  ServiceLocator::resolve<IMathService>((ServiceLocator *)local_100);
  std::shared_ptr<IMathService>::operator=
            ((shared_ptr<IMathService> *)local_a0,(shared_ptr<IMathService> *)local_100);
  std::shared_ptr<IMathService>::~shared_ptr((shared_ptr<IMathService> *)local_100);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_a0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!mathService",
                  "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                  ,0x36,"int main()");
  }
  std::function<std::shared_ptr<IMathService>()>::function<main::__0,void>
            ((function<std::shared_ptr<IMathService>()> *)&local_120,
             (anon_class_1_0_00000001 *)(local_138 + 0x17));
  ServiceLocator::registerCreator<IMathService>((ServiceLocator *)local_80,&local_120);
  std::function<std::shared_ptr<IMathService>_()>::~function(&local_120);
  ServiceLocator::resolve<IMathService>((ServiceLocator *)local_138);
  std::shared_ptr<IMathService>::operator=
            ((shared_ptr<IMathService> *)local_a0,(shared_ptr<IMathService> *)local_138);
  std::shared_ptr<IMathService>::~shared_ptr((shared_ptr<IMathService> *)local_138);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_a0);
  if (!bVar1) {
    __assert_fail("mathService",
                  "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                  ,0x3e,"int main()");
  }
  std::static_pointer_cast<MathService,IMathService>(&local_148);
  std::shared_ptr<MathService>::operator=
            ((shared_ptr<MathService> *)local_d0,(shared_ptr<MathService> *)&local_148);
  std::shared_ptr<MathService>::~shared_ptr((shared_ptr<MathService> *)&local_148);
  peVar3 = std::__shared_ptr_access<MathService,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MathService,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_d0);
  if (peVar3->state != 0) {
    __assert_fail("test->state == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                  ,0x42,"int main()");
  }
  peVar3 = std::__shared_ptr_access<MathService,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MathService,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_d0);
  peVar3->state = 1;
  ServiceLocator::resolve<IMathService>((ServiceLocator *)local_168);
  std::static_pointer_cast<MathService,IMathService>((shared_ptr<IMathService> *)(local_168 + 0x10))
  ;
  std::shared_ptr<MathService>::operator=
            ((shared_ptr<MathService> *)local_d0,(shared_ptr<MathService> *)(local_168 + 0x10));
  std::shared_ptr<MathService>::~shared_ptr((shared_ptr<MathService> *)(local_168 + 0x10));
  std::shared_ptr<IMathService>::~shared_ptr((shared_ptr<IMathService> *)local_168);
  peVar3 = std::__shared_ptr_access<MathService,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MathService,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_d0);
  if (peVar3->state == 0) {
    locator.creators._M_h._M_single_bucket._4_4_ = 0;
    std::shared_ptr<MathService>::~shared_ptr((shared_ptr<MathService> *)local_d0);
    std::shared_ptr<IMathService>::~shared_ptr((shared_ptr<IMathService> *)local_a0);
    ServiceLocator::~ServiceLocator((ServiceLocator *)local_80);
    return locator.creators._M_h._M_single_bucket._4_4_;
  }
  __assert_fail("test->state == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                ,0x46,"int main()");
}

Assistant:

int main()
{
	ServiceLocator locator;

	//Single instance creation => everytime "resolve" gets called the same instance will be returned
	locator.registerInstance<IMathService>(new MathService());

	auto mathService = locator.resolve<IMathService>();
	assert(mathService);
	assert(mathService->add(10, 20) == 30);
	assert(mathService->subtract(30, 10) == 20);
	assert(mathService->multiply(2, 2.5) == 5);
	assert(mathService->divide(30, 10) == 3);

	//simple check if it's really the same instance
	auto test = std::static_pointer_cast<MathService>(mathService);
	assert(test->state == 0);
	test->state = 1;
	test = std::static_pointer_cast<MathService>(locator.resolve<IMathService>());
	assert(test->state == 1);


	//explicit clear of all instances
	locator.clear();
	//there should be no IMathService anymore
	mathService = locator.resolve<IMathService>();
	assert(!mathService);


	//you can create lazy instances with a delegate which returns a shared ptr
	//the instance will be created everytime the "resolve" method gets called
	locator.registerCreator<IMathService>([]() { return std::make_shared<MathService>(); });
	
	mathService = locator.resolve<IMathService>();
	assert(mathService);

	//same check as above but this time changing the state and resolving the service should return an other instance
	test = std::static_pointer_cast<MathService>(mathService);
	assert(test->state == 0);
	test->state = 1;

	test = std::static_pointer_cast<MathService>(locator.resolve<IMathService>());
	assert(test->state == 0);

	return 0;
}